

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

number_validator<unsigned_char> __thiscall goodform::sub_form::uint8(sub_form *this)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  undefined8 *in_RSI;
  number_validator<unsigned_char> nVar3;
  uint8_t val;
  uchar local_5a;
  allocator<char> local_59;
  string local_58;
  error_message local_38;
  
  bVar1 = convert<unsigned_char>((any *)in_RSI[1],&local_5a);
  uVar2 = extraout_RDX;
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"NOT A uint8_t",&local_59);
    error_message::error_message(&local_38,&local_58);
    std::__cxx11::string::operator=((string *)*in_RSI,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    uVar2 = extraout_RDX_00;
  }
  this->error_ = (error_message *)*in_RSI;
  *(uchar *)&this->variant_ = local_5a;
  nVar3._8_8_ = uVar2;
  nVar3.error_ = (error_message *)this;
  return nVar3;
}

Assistant:

number_validator<std::uint8_t> sub_form::uint8()
  {
    std::uint8_t val;
    if (!convert(this->variant_, val))
      this->error_ = error_message("NOT A uint8_t");
    return number_validator<std::uint8_t>(val, this->error_);
  }